

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

int xmlRegExecSetErrString(xmlRegExecCtxtPtr exec,xmlChar *value)

{
  int iVar1;
  xmlChar *pxVar2;
  
  if (exec->errString != (xmlChar *)0x0) {
    (*xmlFree)(exec->errString);
  }
  if (value == (xmlChar *)0x0) {
    exec->errString = (xmlChar *)0x0;
    iVar1 = 0;
  }
  else {
    pxVar2 = xmlStrdup(value);
    exec->errString = pxVar2;
    iVar1 = 0;
    if (pxVar2 == (xmlChar *)0x0) {
      exec->status = -5;
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

static int
xmlRegExecSetErrString(xmlRegExecCtxtPtr exec, const xmlChar *value) {
    if (exec->errString != NULL)
        xmlFree(exec->errString);
    if (value == NULL) {
        exec->errString = NULL;
    } else {
        exec->errString = xmlStrdup(value);
        if (exec->errString == NULL) {
            exec->status = XML_REGEXP_OUT_OF_MEMORY;
            return(-1);
        }
    }
    return(0);
}